

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O0

void Commands::Dress2(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  Command_Source *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_type sVar6;
  undefined4 extraout_var;
  const_reference pvVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *this;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  allocator<char> local_179;
  string local_178;
  string local_158;
  int local_134;
  undefined1 local_130 [4];
  int gfx_id;
  string slot;
  string local_108;
  string local_e8;
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_48;
  Character *local_28;
  Character *victim;
  Command_Source *pCStack_18;
  int argp;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  victim._4_4_ = 0;
  pCStack_18 = from;
  from_local = (Command_Source *)arguments;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(arguments);
  if (sVar6 < 3) {
    iVar3 = (*pCStack_18->_vptr_Command_Source[3])();
    local_28 = (Character *)CONCAT44(extraout_var_00,iVar3);
  }
  else {
    iVar3 = (*pCStack_18->_vptr_Command_Source[4])();
    sVar6 = (size_type)victim._4_4_;
    victim._4_4_ = victim._4_4_ + 1;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)from_local,sVar6);
    std::__cxx11::string::string((string *)&local_48,(string *)pvVar7);
    local_28 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar3),&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  pCVar1 = pCStack_18;
  if ((local_28 == (Character *)0x0) || ((local_28->nowhere & 1U) != 0)) {
    iVar3 = (*pCStack_18->_vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"character_not_found",&local_99);
    I18N::Format<>(&local_78,(I18N *)(CONCAT44(extraout_var_01,iVar3) + 0x490),&local_98);
    (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    uVar4 = (**(local_28->super_Command_Source)._vptr_Command_Source)();
    iVar3 = (*pCStack_18->_vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"cmdprotect",&local_c1);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)(CONCAT44(extraout_var_02,iVar3) + 0x1f0),&local_c0);
    iVar3 = util::variant::operator_cast_to_int(this);
    bVar2 = false;
    if (iVar3 <= (int)(uVar4 & 0xff)) {
      uVar4 = (**(local_28->super_Command_Source)._vptr_Command_Source)();
      uVar5 = (**pCStack_18->_vptr_Command_Source)();
      bVar2 = (uVar5 & 0xff) < (uVar4 & 0xff);
    }
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pCVar1 = pCStack_18;
    if (bVar2) {
      iVar3 = (*pCStack_18->_vptr_Command_Source[4])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"command_access_denied",
                 (allocator<char> *)(slot.field_2._M_local_buf + 0xf));
      I18N::Format<>(&local_e8,(I18N *)(CONCAT44(extraout_var_03,iVar3) + 0x490),&local_108);
      (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)(slot.field_2._M_local_buf + 0xf));
    }
    else {
      sVar6 = (size_type)victim._4_4_;
      victim._4_4_ = victim._4_4_ + 1;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)from_local,sVar6);
      util::lowercase((string *)local_130,pvVar7);
      sVar6 = (size_type)victim._4_4_;
      victim._4_4_ = victim._4_4_ + 1;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)from_local,sVar6);
      local_134 = util::to_int(pvVar7);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_130,"hat");
      if (bVar2) {
        Character::Dress(local_28,Hat,(unsigned_short)local_134);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_130,"armor");
        if (bVar2) {
          Character::Dress(local_28,Armor,(unsigned_short)local_134);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_130,"boots");
          if (bVar2) {
            Character::Dress(local_28,Boots,(unsigned_short)local_134);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130,"weapon");
            if (bVar2) {
              Character::Dress(local_28,Weapon,(unsigned_short)local_134);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130,"shield");
              pCVar1 = pCStack_18;
              if (bVar2) {
                Character::Dress(local_28,Shield,(unsigned_short)local_134);
              }
              else {
                iVar3 = (*pCStack_18->_vptr_Command_Source[4])();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_178,"invalid_dress_slot",&local_179);
                I18N::Format<>(&local_158,(I18N *)(CONCAT44(extraout_var_04,iVar3) + 0x490),
                               &local_178);
                (*pCVar1->_vptr_Command_Source[5])(pCVar1,&local_158);
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator(&local_179);
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  return;
}

Assistant:

void Dress2(const std::vector<std::string>& arguments, Command_Source* from)
{
	int argp = 0;
	Character *victim;

	if (arguments.size() > 2)
		victim = from->SourceWorld()->GetCharacter(arguments[argp++]);
	else
		victim = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	if (victim->SourceAccess() >= int(from->SourceWorld()->admin_config["cmdprotect"])
	 && victim->SourceAccess() > from->SourceAccess())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
		return;
	}

	std::string slot = util::lowercase(arguments[argp++]);
	int gfx_id = util::to_int(arguments[argp++]);

		 if (slot == "hat")    victim->Dress(Character::Hat, gfx_id);
	else if (slot == "armor")  victim->Dress(Character::Armor, gfx_id);
	else if (slot == "boots")  victim->Dress(Character::Boots, gfx_id);
	else if (slot == "weapon") victim->Dress(Character::Weapon, gfx_id);
	else if (slot == "shield") victim->Dress(Character::Shield, gfx_id);
	else from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_dress_slot"));
}